

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSet.hpp
# Opt level: O0

void __thiscall antlr::BitSet::BitSet(BitSet *this,BitSet *param_2)

{
  vector<bool,_std::allocator<bool>_> *in_stack_000000a8;
  vector<bool,_std::allocator<bool>_> *in_stack_000000b0;
  
  std::vector<bool,_std::allocator<bool>_>::vector(in_stack_000000b0,in_stack_000000a8);
  return;
}

Assistant:

class ANTLR_API BitSet {
private:
	ANTLR_USE_NAMESPACE(std)vector<bool> storage;

public:
	BitSet( unsigned int nbits=64 );
	BitSet( const unsigned long* bits_, unsigned int nlongs);
	~BitSet();

	void add( unsigned int el );

	bool member( unsigned int el ) const;

	ANTLR_USE_NAMESPACE(std)vector<unsigned int> toArray() const;
}